

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battery_level.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  float fVar4;
  float fVar5;
  bool local_221;
  float battery_charge;
  float battery_capacity;
  Create local_1e8 [8];
  Create robot;
  allocator local_91;
  string local_90 [32];
  undefined4 local_70;
  int baud;
  allocator local_59;
  string local_58 [8];
  string port;
  RobotModel model;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"/dev/ttyUSB0",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_70 = 0x1c200;
  local_221 = false;
  if (1 < argc) {
    pcVar3 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar3,&local_91);
    local_221 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"create1");
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if (local_221 == false) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Running driver for Create 2");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_70 = 0xe100;
    poVar2 = std::operator<<((ostream *)&std::cout,"Running driver for Create 1");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  create::Create::Create(local_1e8,1);
  bVar1 = create::Create::connect((string *)local_1e8,(int *)local_58);
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    create::Create::~Create(local_1e8);
    std::__cxx11::string::~string(local_58);
    return 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Connected to robot");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  create::Create::setMode((CreateMode *)local_1e8);
  fVar4 = (float)create::Create::getBatteryCapacity();
  do {
    fVar5 = (float)create::Create::getBatteryCharge();
    poVar2 = std::operator<<((ostream *)&std::cout,"\rBattery level: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)(fVar5 / fVar4) * 100.0);
    std::operator<<(poVar2,"%");
    usleep(100000);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  // Get battery capacity (max charge)
  const float battery_capacity = robot.getBatteryCapacity();

  float battery_charge = 0.0f;
  while (true) {
    // Get battery charge
    battery_charge = robot.getBatteryCharge();

    // Print battery percentage
    std::cout << "\rBattery level: " << (battery_charge / battery_capacity) * 100.0 << "%";

    usleep(100000);  // 10 Hz
  }

  return 0;
}